

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O0

int wally_addr_segwit_n_to_bytes
              (char *addr,size_t addr_len,char *addr_family,size_t addr_family_len,uint32_t flags,
              uchar *bytes_out,size_t len,size_t *written)

{
  int iVar1;
  byte local_6d;
  int local_6c;
  uint8_t local_68 [3];
  uint8_t witver;
  int ret;
  uchar decoded [40];
  uchar *bytes_out_local;
  uint32_t flags_local;
  size_t addr_family_len_local;
  char *addr_family_local;
  size_t addr_len_local;
  char *addr_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (((((flags == 0) && (addr_family != (char *)0x0)) && (addr_family_len != 0)) &&
      ((addr != (char *)0x0 && (7 < addr_len)))) &&
     ((bytes_out != (uchar *)0x0 && ((len != 0 && (written != (size_t *)0x0)))))) {
    decoded._32_8_ = bytes_out;
    iVar1 = segwit_addr_decode(&local_6d,local_68,written,addr_family,addr_family_len,addr,addr_len)
    ;
    if (iVar1 == 0) {
      *written = 0;
      local_6c = -2;
    }
    else {
      local_6c = wally_witness_program_from_bytes_and_version
                           (local_68,*written,(uint)local_6d,0,(uchar *)decoded._32_8_,len,written);
    }
    wally_clear(local_68,0x28);
    addr_local._4_4_ = local_6c;
  }
  else {
    addr_local._4_4_ = -2;
  }
  return addr_local._4_4_;
}

Assistant:

int wally_addr_segwit_n_to_bytes(const char *addr, size_t addr_len,
                                 const char *addr_family, size_t addr_family_len,
                                 uint32_t flags,
                                 unsigned char *bytes_out, size_t len,
                                 size_t *written)
{
    unsigned char decoded[40];
    int ret;
    uint8_t witver;

    if (written)
        *written = 0;

    if (flags || !addr_family || !addr_family_len || !addr || addr_len < 8 || !bytes_out || !len || !written)
        return WALLY_EINVAL;

    if (!segwit_addr_decode(&witver, decoded, written, addr_family, addr_family_len, addr, addr_len)) {
        *written = 0;
        ret = WALLY_EINVAL;
    } else {
        ret = wally_witness_program_from_bytes_and_version(
            decoded, *written, witver, flags, bytes_out, len, written);
    }

    wally_clear(decoded, sizeof(decoded));
    return ret;
}